

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::operator-
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this)

{
  NegativeReturnType local_48;
  vectype local_38;
  undefined1 local_28 [8];
  VectorXd c;
  ChebyshevExpansion *this_local;
  
  c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = (Index)this;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_28,&this->m_c);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator-
            (&local_48,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_28);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_38,
             (EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_48);
  ChebyshevExpansion(__return_storage_ptr__,&local_38,this->m_xmin,this->m_xmax);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_38);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::operator-() const{
        Eigen::VectorXd c = m_c;
        return ChebyshevExpansion(-c, m_xmin, m_xmax);
    }